

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_string_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  uint *puVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar6 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar6 != 0)) {
    puVar5 = (uint *)(uVar6 + (long)td->table);
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar7 = ctx->p;
      ctx->p = pcVar7 + 1;
      *pcVar7 = ',';
    }
    uVar2 = *puVar5;
    iVar1 = *(int *)((long)puVar5 + (ulong)uVar2);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar7 = ctx->p;
    ctx->p = pcVar7 + 1;
    *pcVar7 = '[';
    if (iVar1 != 0) {
      puVar5 = (uint *)((long)puVar5 + (ulong)uVar2 + 4);
      pcVar7 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar7) {
          (*ctx->flush)(ctx,0);
        }
      }
      else {
        ctx->p = pcVar7 + 1;
        *pcVar7 = '\n';
        uVar6 = (ulong)ctx->indent * (long)ctx->level;
        pcVar7 = ctx->pflush;
        pcVar4 = ctx->p;
        if (pcVar7 < pcVar4 + uVar6) {
          if (pcVar7 <= pcVar4) {
            (*ctx->flush)(ctx,0);
            pcVar7 = ctx->pflush;
            pcVar4 = ctx->p;
          }
          sVar8 = (long)pcVar7 - (long)pcVar4;
          if (sVar8 < uVar6) {
            do {
              memset(pcVar4,0x20,sVar8);
              ctx->p = ctx->p + sVar8;
              uVar6 = uVar6 - sVar8;
              (*ctx->flush)(ctx,0);
              pcVar4 = ctx->p;
              sVar8 = (long)ctx->pflush - (long)pcVar4;
            } while (sVar8 < uVar6);
          }
        }
        memset(pcVar4,0x20,uVar6);
        ctx->p = ctx->p + uVar6;
      }
      print_string(ctx,(char *)((uint *)((long)puVar5 + (ulong)*puVar5) + 1),
                   (ulong)*(uint *)((long)puVar5 + (ulong)*puVar5));
      while (iVar1 = iVar1 + -1, iVar1 != 0) {
        pcVar7 = ctx->p;
        ctx->p = pcVar7 + 1;
        *pcVar7 = ',';
        pcVar7 = ctx->p;
        if (ctx->indent == '\0') {
          if (ctx->pflush <= pcVar7) {
            (*ctx->flush)(ctx,0);
          }
        }
        else {
          ctx->p = pcVar7 + 1;
          *pcVar7 = '\n';
          uVar6 = (ulong)ctx->indent * (long)ctx->level;
          pcVar7 = ctx->pflush;
          pcVar4 = ctx->p;
          if (pcVar7 < pcVar4 + uVar6) {
            if (pcVar7 <= pcVar4) {
              (*ctx->flush)(ctx,0);
              pcVar7 = ctx->pflush;
              pcVar4 = ctx->p;
            }
            sVar8 = (long)pcVar7 - (long)pcVar4;
            if (sVar8 < uVar6) {
              do {
                memset(pcVar4,0x20,sVar8);
                ctx->p = ctx->p + sVar8;
                uVar6 = uVar6 - sVar8;
                (*ctx->flush)(ctx,0);
                pcVar4 = ctx->p;
                sVar8 = (long)ctx->pflush - (long)pcVar4;
              } while (sVar8 < uVar6);
            }
          }
          memset(pcVar4,0x20,uVar6);
          ctx->p = ctx->p + uVar6;
        }
        puVar5 = puVar5 + 1;
        print_string(ctx,(char *)((uint *)((long)puVar5 + (ulong)*puVar5) + 1),
                     (ulong)*(uint *)((long)puVar5 + (ulong)*puVar5));
      }
    }
    pcVar7 = ctx->p;
    if (ctx->indent != '\0') {
      ctx->p = pcVar7 + 1;
      *pcVar7 = '\n';
      lVar3 = (long)ctx->level + -1;
      ctx->level = (int)lVar3;
      uVar6 = (ulong)ctx->indent * lVar3;
      pcVar7 = ctx->pflush;
      pcVar4 = ctx->p;
      if (pcVar7 < pcVar4 + uVar6) {
        if (pcVar7 <= pcVar4) {
          (*ctx->flush)(ctx,0);
          pcVar7 = ctx->pflush;
          pcVar4 = ctx->p;
        }
        sVar8 = (long)pcVar7 - (long)pcVar4;
        if (sVar8 < uVar6) {
          do {
            memset(pcVar4,0x20,sVar8);
            ctx->p = ctx->p + sVar8;
            uVar6 = uVar6 - sVar8;
            (*ctx->flush)(ctx,0);
            pcVar4 = ctx->p;
            sVar8 = (long)ctx->pflush - (long)pcVar4;
          } while (sVar8 < uVar6);
        }
      }
      memset(pcVar4,0x20,uVar6);
      pcVar7 = ctx->p + uVar6;
    }
    ctx->p = pcVar7 + 1;
    *pcVar7 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_string_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len)
{
    const uoffset_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
            --count;
        }
        while (count--) {
            ++p;
            print_char(',');
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
        }
        print_end(']');
    }
}